

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::base::WeakPtrFactory<perfetto::ipc::Client>::WeakPtrFactory
          (WeakPtrFactory<perfetto::ipc::Client> *this,Client *owner)

{
  Client **__p;
  shared_ptr<perfetto::ipc::Client_*> local_28;
  Client *local_18;
  Client *owner_local;
  WeakPtrFactory<perfetto::ipc::Client> *this_local;
  
  local_18 = owner;
  owner_local = (Client *)this;
  __p = (Client **)operator_new(8);
  *__p = local_18;
  ::std::shared_ptr<perfetto::ipc::Client*>::shared_ptr<perfetto::ipc::Client*,void>
            ((shared_ptr<perfetto::ipc::Client*> *)&local_28,__p);
  WeakPtr<perfetto::ipc::Client>::WeakPtr(&this->weak_ptr_,&local_28);
  std::shared_ptr<perfetto::ipc::Client_*>::~shared_ptr(&local_28);
  return;
}

Assistant:

explicit WeakPtrFactory(T* owner)
      : weak_ptr_(std::shared_ptr<T*>(new T* {owner})) {
    PERFETTO_DCHECK_THREAD(thread_checker);
  }